

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

void testutil_random_fe_magnitude(secp256k1_fe *fe,int m)

{
  uint32_t uVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  
  uVar1 = testrand_int(m + 1);
  secp256k1_fe_impl_normalize(fe);
  if (uVar1 != 0) {
    lVar2 = (long)(int)(uVar1 - 1);
    lVar3 = (lVar2 << 0x35) + lVar2 * -2;
    fe->n[0] = fe->n[0] + lVar2 * 0x1ffffdfffff85e;
    auVar4._8_4_ = (int)lVar3;
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
    fe->n[1] = lVar3 + fe->n[1];
    fe->n[2] = auVar4._8_8_ + fe->n[2];
    fe->n[3] = fe->n[3] + lVar3;
    fe->n[4] = fe->n[4] + (lVar2 << 0x31) + lVar2 * -2;
  }
  return;
}

Assistant:

static void testutil_random_fe_magnitude(secp256k1_fe *fe, int m) {
    secp256k1_fe zero;
    int n = testrand_int(m + 1);
    secp256k1_fe_normalize(fe);
    if (n == 0) {
        return;
    }
    secp256k1_fe_set_int(&zero, 0);
    secp256k1_fe_negate(&zero, &zero, 0);
    secp256k1_fe_mul_int_unchecked(&zero, n - 1);
    secp256k1_fe_add(fe, &zero);
#ifdef VERIFY
    CHECK(fe->magnitude == n);
#endif
}